

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Simplex_tree.h
# Opt level: O3

pair<boost::container::vec_iterator<std::pair<short,_Gudhi::Simplex_tree_node_explicit_storage<Gudhi::Simplex_tree<Gudhi::Simplex_tree_options_custom_fil_values_default>_>_>_*,_true>,_bool>
 __thiscall
Gudhi::Simplex_tree<Gudhi::Simplex_tree_options_custom_fil_values_default>::
insert_simplex_and_subfaces<std::initializer_list<short>>
          (Simplex_tree<Gudhi::Simplex_tree_options_custom_fil_values_default> *this,
          initializer_list<short> *Nsimplex,Filtration_value *filtration)

{
  short sVar1;
  pointer piVar2;
  pointer piVar3;
  long lVar4;
  int iVar5;
  ulong uVar6;
  Filtration_value *pFVar7;
  undefined1 *puVar8;
  undefined8 *puVar9;
  short sVar10;
  __normal_iterator<short_*,_std::vector<short,_std::allocator<short>_>_> _Var11;
  Filtration_value *pFVar12;
  const_iterator __cbeg;
  __normal_iterator<short_*,_std::vector<short,_std::allocator<short>_>_> last;
  Filtration_value *filt;
  long *in_FS_OFFSET;
  pair<boost::container::vec_iterator<std::pair<short,_Gudhi::Simplex_tree_node_explicit_storage<Gudhi::Simplex_tree<Gudhi::Simplex_tree_options_custom_fil_values_default>_>_>_*,_true>,_bool>
  pVar13;
  
  piVar2 = (filtration->super_vector<int,_std::allocator<int>_>).
           super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data._M_finish;
  if (piVar2 == (pointer)0x0) {
    (this->nodes_label_to_list_)._M_h._M_buckets = (__buckets_ptr)0x0;
    *(undefined1 *)&(this->nodes_label_to_list_)._M_h._M_bucket_count = 1;
  }
  else {
    piVar3 = (filtration->super_vector<int,_std::allocator<int>_>).
             super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data._M_start;
    if ((char)in_FS_OFFSET[-0xd] == '\0') {
      insert_simplex_and_subfaces<std::initializer_list<short>>();
    }
    lVar4 = in_FS_OFFSET[-0x10];
    if (in_FS_OFFSET[-0xf] != lVar4) {
      in_FS_OFFSET[-0xf] = lVar4;
    }
    std::vector<short,std::allocator<short>>::_M_range_insert<short_const*>
              ((vector<short,std::allocator<short>> *)(*in_FS_OFFSET + -0x80),lVar4,piVar3,
               (long)piVar3 + (long)piVar2 * 2);
    last._M_current = (short *)in_FS_OFFSET[-0x10];
    filt = (Filtration_value *)in_FS_OFFSET[-0xf];
    if ((Filtration_value *)last._M_current != filt) {
      uVar6 = (long)filt - (long)last._M_current >> 1;
      lVar4 = 0x3f;
      if (uVar6 != 0) {
        for (; uVar6 >> lVar4 == 0; lVar4 = lVar4 + -1) {
        }
      }
      std::
      __introsort_loop<__gnu_cxx::__normal_iterator<short*,std::vector<short,std::allocator<short>>>,long,__gnu_cxx::__ops::_Iter_less_iter>
                (last._M_current,filt,((uint)lVar4 ^ 0x3f) * 2 ^ 0x7e);
      std::
      __final_insertion_sort<__gnu_cxx::__normal_iterator<short*,std::vector<short,std::allocator<short>>>,__gnu_cxx::__ops::_Iter_less_iter>
                (last._M_current,filt);
      last._M_current = (short *)in_FS_OFFSET[-0x10];
      filt = (Filtration_value *)in_FS_OFFSET[-0xf];
    }
    if ((Filtration_value *)last._M_current != filt) {
      pFVar12 = (Filtration_value *)(last._M_current + 1);
      do {
        pFVar7 = pFVar12;
        if (pFVar7 == filt) goto LAB_0011d5d5;
        sVar10 = *(short *)((long)&pFVar7[-1].super_vector<int,_std::allocator<int>_>.
                                   super__Vector_base<int,_std::allocator<int>_>._M_impl.
                                   super__Vector_impl_data._M_end_of_storage + 6);
        pFVar12 = (Filtration_value *)
                  ((long)&(pFVar7->super_vector<int,_std::allocator<int>_>).
                          super__Vector_base<int,_std::allocator<int>_>._M_impl.
                          super__Vector_impl_data._M_start + 2);
      } while (sVar10 != *(short *)&(pFVar7->super_vector<int,_std::allocator<int>_>).
                                    super__Vector_base<int,_std::allocator<int>_>._M_impl.
                                    super__Vector_impl_data._M_start);
      puVar8 = (undefined1 *)
               ((long)&pFVar7[-1].super_vector<int,_std::allocator<int>_>.
                       super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data
                       ._M_end_of_storage + 6);
      for (; pFVar12 != filt;
          pFVar12 = (Filtration_value *)
                    ((long)&(pFVar12->super_vector<int,_std::allocator<int>_>).
                            super__Vector_base<int,_std::allocator<int>_>._M_impl.
                            super__Vector_impl_data._M_start + 2)) {
        sVar1 = *(short *)&(pFVar12->super_vector<int,_std::allocator<int>_>).
                           super__Vector_base<int,_std::allocator<int>_>._M_impl.
                           super__Vector_impl_data._M_start;
        if (sVar10 != sVar1) {
          *(short *)(puVar8 + 2) = sVar1;
          puVar8 = puVar8 + 2;
        }
        sVar10 = sVar1;
      }
      pFVar12 = (Filtration_value *)(puVar8 + 2);
      if (pFVar12 != filt) {
        in_FS_OFFSET[-0xf] = (long)pFVar12;
        filt = pFVar12;
      }
    }
LAB_0011d5d5:
    if ((Filtration_value *)last._M_current != filt) {
      _Var11._M_current = last._M_current;
      do {
        if (*(short *)&(((Filtration_value *)_Var11._M_current)->
                       super_vector<int,_std::allocator<int>_>).
                       super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data
                       ._M_start == (short)Nsimplex[3]._M_len) {
          puVar9 = (undefined8 *)__cxa_allocate_exception(8);
          *puVar9 = "cannot use the dummy null_vertex() as a real vertex";
          __cxa_throw(puVar9,&char_const*::typeinfo,0);
        }
        _Var11._M_current =
             (short *)((long)&(((Filtration_value *)_Var11._M_current)->
                              super_vector<int,_std::allocator<int>_>).
                              super__Vector_base<int,_std::allocator<int>_>._M_impl.
                              super__Vector_impl_data._M_start + 2);
      } while ((Filtration_value *)_Var11._M_current != filt);
    }
    iVar5 = (int)((ulong)((long)filt - (long)last._M_current) >> 1) + -1;
    if (iVar5 < *(int *)&Nsimplex[8]._M_array) {
      iVar5 = *(int *)&Nsimplex[8]._M_array;
    }
    *(int *)&Nsimplex[8]._M_array = iVar5;
    pVar13 = rec_insert_simplex_and_subfaces_sorted<__gnu_cxx::__normal_iterator<short*,std::vector<short,std::allocator<short>>>>
                       (this,(Siblings *)Nsimplex,
                        (__normal_iterator<short_*,_std::vector<short,_std::allocator<short>_>_>)
                        (Nsimplex + 4),last,filt);
    filtration = pVar13._8_8_;
  }
  pVar13._8_8_ = filtration;
  pVar13.first.m_ptr =
       (pair<short,_Gudhi::Simplex_tree_node_explicit_storage<Gudhi::Simplex_tree<Gudhi::Simplex_tree_options_custom_fil_values_default>_>_>
        *)this;
  return pVar13;
}

Assistant:

std::pair<Simplex_handle, bool> insert_simplex_and_subfaces(
      const InputVertexRange& Nsimplex,
      const Filtration_value& filtration = Filtration_value())
  {
    auto first = std::begin(Nsimplex);
    auto last = std::end(Nsimplex);

    if (first == last)
      return { null_simplex(), true }; // FIXME: false would make more sense to me.

    thread_local std::vector<Vertex_handle> copy;
    copy.clear();
    copy.insert(copy.end(), first, last);
    std::sort(copy.begin(), copy.end());
    auto last_unique = std::unique(copy.begin(), copy.end());
    copy.erase(last_unique, copy.end());
    GUDHI_CHECK_code(
      for (Vertex_handle v : copy)
        GUDHI_CHECK(v != null_vertex(), "cannot use the dummy null_vertex() as a real vertex");
    )
    // Update dimension if needed. We could wait to see if the insertion succeeds, but I doubt there is much to gain.
    dimension_ = (std::max)(dimension_, static_cast<int>(std::distance(copy.begin(), copy.end())) - 1);

    return rec_insert_simplex_and_subfaces_sorted(root(), copy.begin(), copy.end(), filtration);
  }